

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_upgrade_internal
              (nghttp2_session *session,uint8_t *settings_payload,size_t settings_payloadlen,
              void *stream_user_data)

{
  undefined1 auVar1 [16];
  int iVar2;
  nghttp2_stream *stream;
  nghttp2_settings_entry *iv;
  size_t niv;
  nghttp2_priority_spec pri_spec;
  nghttp2_frame frame;
  nghttp2_settings_entry *local_90;
  size_t local_88;
  nghttp2_priority_spec local_7c;
  nghttp2_frame local_70;
  
  if (session->server == '\0') {
    if (session->next_stream_id != 1) {
      return -0x1f9;
    }
  }
  else if (0 < session->last_recv_stream_id) {
    return -0x1f9;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = settings_payloadlen;
  iVar2 = -0x1f5;
  if (((SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),0) >> 1 |
       (ulong)((auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab) & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) << 0x3f) < 0x2aaaaaaaaaaaaaab) &&
     (iVar2 = -0x219, settings_payloadlen / 6 <= session->max_settings)) {
    iVar2 = nghttp2_frame_unpack_settings_payload2
                      (&local_90,&local_88,settings_payload,settings_payloadlen,&session->mem);
    if (iVar2 == 0) {
      if (session->server == '\0') {
        iVar2 = nghttp2_submit_settings(session,'\0',local_90,local_88);
      }
      else {
        nghttp2_frame_hd_init(&local_70.hd,settings_payloadlen,'\x04','\0',0);
        local_70.settings.iv = local_90;
        local_70.data.padlen = local_88;
        iVar2 = nghttp2_session_on_settings_received(session,&local_70,1);
      }
      nghttp2_mem_free(&session->mem,local_90);
      if (iVar2 == 0) {
        nghttp2_priority_spec_default_init(&local_7c);
        if (session->server != '\0') {
          stream_user_data = (void *)0x0;
        }
        stream = nghttp2_session_open_stream
                           (session,1,'\0',&local_7c,NGHTTP2_STREAM_OPENING,stream_user_data);
        if (stream == (nghttp2_stream *)0x0) {
          iVar2 = -0x385;
        }
        else {
          if (session->server == '\0') {
            nghttp2_stream_shutdown(stream,NGHTTP2_SHUT_WR);
            session->last_sent_stream_id = 1;
            session->next_stream_id = session->next_stream_id + 2;
          }
          else {
            nghttp2_stream_shutdown(stream,NGHTTP2_SHUT_RD);
            session->last_recv_stream_id = 1;
            session->last_proc_stream_id = 1;
          }
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int nghttp2_session_upgrade_internal(nghttp2_session *session,
                                            const uint8_t *settings_payload,
                                            size_t settings_payloadlen,
                                            void *stream_user_data) {
  nghttp2_stream *stream;
  nghttp2_frame frame;
  nghttp2_settings_entry *iv;
  size_t niv;
  int rv;
  nghttp2_priority_spec pri_spec;
  nghttp2_mem *mem;

  mem = &session->mem;

  if ((!session->server && session->next_stream_id != 1) ||
      (session->server && session->last_recv_stream_id >= 1)) {
    return NGHTTP2_ERR_PROTO;
  }
  if (settings_payloadlen % NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }
  /* SETTINGS frame contains too many settings */
  if (settings_payloadlen / NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH >
      session->max_settings) {
    return NGHTTP2_ERR_TOO_MANY_SETTINGS;
  }
  rv = nghttp2_frame_unpack_settings_payload2(&iv, &niv, settings_payload,
                                              settings_payloadlen, mem);
  if (rv != 0) {
    return rv;
  }

  if (session->server) {
    nghttp2_frame_hd_init(&frame.hd, settings_payloadlen, NGHTTP2_SETTINGS,
                          NGHTTP2_FLAG_NONE, 0);
    frame.settings.iv = iv;
    frame.settings.niv = niv;
    rv = nghttp2_session_on_settings_received(session, &frame, 1 /* No ACK */);
  } else {
    rv = nghttp2_submit_settings(session, NGHTTP2_FLAG_NONE, iv, niv);
  }
  nghttp2_mem_free(mem, iv);
  if (rv != 0) {
    return rv;
  }

  nghttp2_priority_spec_default_init(&pri_spec);

  stream = nghttp2_session_open_stream(
      session, 1, NGHTTP2_STREAM_FLAG_NONE, &pri_spec, NGHTTP2_STREAM_OPENING,
      session->server ? NULL : stream_user_data);
  if (stream == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  /* We don't call nghttp2_session_adjust_closed_stream(), since this
     should be the first stream open. */

  if (session->server) {
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
    session->last_recv_stream_id = 1;
    session->last_proc_stream_id = 1;
  } else {
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
    session->last_sent_stream_id = 1;
    session->next_stream_id += 2;
  }
  return 0;
}